

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

uint str_octal_to_uint(char *str)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    bVar1 = *str;
    if (bVar1 == 0) {
      return uVar2;
    }
    if ((byte)(bVar1 - 0x38) < 0xf8) break;
    uVar2 = ((uint)bVar1 + uVar2 * 8) - 0x30;
    str = (char *)((byte *)str + 1);
  }
  return 0;
}

Assistant:

unsigned int str_octal_to_uint(const char *str) {
  unsigned int result = 0;
  const char *p = str;
  int non_zero_digit = 0;
  while (*p) {
    if (*p < '0' || *p > '7')
      return 0;
    if (*p != 0)
      non_zero_digit = 1;
    if (non_zero_digit != 0) {
      unsigned int val = *p - '0';
      result = result << 3;
      result += val;
    }
    ++p;
  }
  return result;
}